

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudo-types.cpp
# Opt level: O2

void yactfr::internal::anon_unknown_23::validatePseudoUIntTypeRoles
               (PseudoDt *pseudoDt,UnsignedIntegerTypeRoleSet *allowedRoles)

{
  string msg;
  TextLocation loc;
  Set set;
  undefined8 in_stack_ffffffffffffff70;
  undefined8 uVar1;
  undefined8 uVar2;
  string local_60 [32];
  _Hashtable<const_yactfr::internal::PseudoDt_*,_const_yactfr::internal::PseudoDt_*,_std::allocator<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Identity,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_40;
  
  if (pseudoDt != (PseudoDt *)0x0) {
    uVar1 = &stack0xffffffffffffff78;
    uVar2 = 0;
    findPseudoDts((Set *)&local_40,pseudoDt,(PredFunc *)&stack0xffffffffffffff80);
    std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffff80);
    if (local_40._M_element_count != 0) {
      std::__cxx11::string::string
                (local_60,"Unsigned integer type has at least one invalid role within its scope.",
                 (allocator *)&stack0xffffffffffffff80);
      msg.field_2._8_8_ = in_stack_ffffffffffffff70;
      msg._0_24_ = *(undefined1 (*) [24])(local_40._M_before_begin._M_nxt[1]._M_nxt + 1);
      loc._lineNumber = uVar1;
      loc._offset = (Index)allowedRoles;
      loc._colNumber = uVar2;
      throwTextParseError(msg,loc);
    }
    std::
    _Hashtable<const_yactfr::internal::PseudoDt_*,_const_yactfr::internal::PseudoDt_*,_std::allocator<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Identity,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_40);
  }
  return;
}

Assistant:

void validatePseudoUIntTypeRoles(const PseudoDt * const pseudoDt,
                                 const UnsignedIntegerTypeRoleSet& allowedRoles)
{
    if (!pseudoDt) {
        return;
    }

    // find _invalid_ pseudo unsigned integer types
    const auto set = findPseudoUIntTypes(*pseudoDt, [&allowedRoles](auto& pseudoUIntType, auto) {
        // get roles
        auto& roles = call([&pseudoUIntType]() -> const UnsignedIntegerTypeRoleSet& {
            if (isFlUIntNotDtWrapper(pseudoUIntType)) {
                return static_cast<const PseudoFlUIntType&>(pseudoUIntType).roles();
            } else {
                assert(pseudoUIntType.kind() == PseudoDt::Kind::ScalarDtWrapper);

                auto& dt = static_cast<const PseudoScalarDtWrapper&>(pseudoUIntType).dt();

                if (dt.isFixedLengthUnsignedIntegerType()) {
                    return dt.asFixedLengthUnsignedIntegerType().roles();
                } else {
                    assert(dt.isVariableLengthUnsignedIntegerType());
                    return dt.asVariableLengthUnsignedIntegerType().roles();
                }
            }
        });

        for (auto& role : roles) {
            if (allowedRoles.count(role) == 0) {
                // invalid: `role` is not an element of `allowedRoles`
                return true;
            }
        }

        return false;
    });

    if (!set.empty()) {
        throwTextParseError("Unsigned integer type has at least one invalid role within its scope.",
                            (*set.begin())->loc());
    }
}